

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptSet>::GetChildren
          (RecyclableCollectionObjectWalker<Js::JavascriptSet> *this)

{
  bool bVar1;
  Iterator iterator;
  
  VarTo<Js::JavascriptSet>(this->instance);
  JavascriptSet::GetIterator((JavascriptSet *)&stack0xffffffffffffffc8);
  while( true ) {
    bVar1 = MapOrSetDataList<void_*>::Iterator::Next((Iterator *)&stack0xffffffffffffffc8);
    if (!bVar1) break;
    iterator.current.ptr = iterator.list.ptr[1].first.ptr;
    JsUtil::
    List<Js::RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet>,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this->propertyList,
          (RecyclableCollectionObjectWalkerPropertyData<Js::JavascriptSet> *)&iterator.current);
  }
  return;
}

Assistant:

void RecyclableCollectionObjectWalker<JavascriptSet>::GetChildren()
    {
        JavascriptSet* data = VarTo<JavascriptSet>(instance);
        auto iterator = data->GetIterator();
        while (iterator.Next())
        {
            Var value = iterator.Current();
            propertyList->Add(RecyclableCollectionObjectWalkerPropertyData<JavascriptSet>(value));
        }
    }